

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b4327e::X509Test_SortRDN_Test::TestBody(X509Test_SortRDN_Test *this)

{
  int iVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  char *pcVar2;
  pointer *__ptr;
  uint8_t *der;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  UniquePtr<X509_NAME> name;
  int der_len;
  UniquePtr<uint8_t> free_der;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  Bytes local_58;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  _Head_base<0UL,_X509_name_st_*,_false> local_28;
  int local_1c;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_18;
  
  local_28._M_head_impl = (X509_name_st *)X509_NAME_new();
  local_68[0] = local_28._M_head_impl != (X509_name_st *)0x0;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28._M_head_impl == (X509_name_st *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)local_68,(AssertionResult *)0x546ced,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1b9c,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
LAB_00407e02:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_60;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_58.span_.data_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58.span_.data_ + 8))();
    }
    local_40 = local_60;
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00407e49;
  }
  else {
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID((X509_NAME *)local_28._M_head_impl,0xd,0x1001,"A",1,-1,0);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_new_rdn(\"A\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1baa,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID((X509_NAME *)local_28._M_head_impl,0xd,0x1001,"B",1,-1,-1);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_prev_rdn(\"B\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bab,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID((X509_NAME *)local_28._M_head_impl,0xd,0x1001,"AA",2,-1,-1);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_prev_rdn(\"AA\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bac,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID
                      ((X509_NAME *)local_28._M_head_impl,0xd,0x1001,(uchar *)"AB",2,-1,-1);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_prev_rdn(\"AB\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bad,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID
                      ((X509_NAME *)local_28._M_head_impl,0xd,0x1001,(uchar *)"AB",2,-1,0);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_new_rdn(\"AB\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bb0,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID((X509_NAME *)local_28._M_head_impl,0xd,0x1001,"AA",2,-1,-1);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_prev_rdn(\"AA\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bb1,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID((X509_NAME *)local_28._M_head_impl,0xd,0x1001,"B",1,-1,-1);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_prev_rdn(\"B\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bb2,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID((X509_NAME *)local_28._M_head_impl,0xd,0x1001,"A",1,-1,-1);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_prev_rdn(\"A\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bb3,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID((X509_NAME *)local_28._M_head_impl,0xd,0x1001,"A",1,-1,0);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_new_rdn(\"A\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bb6,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID((X509_NAME *)local_28._M_head_impl,0xd,0x1001,"AA",2,-1,-1);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_prev_rdn(\"AA\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bb7,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID((X509_NAME *)local_28._M_head_impl,0xd,0x1001,"B",1,-1,-1);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_prev_rdn(\"B\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bb8,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    pcVar2 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID
                      ((X509_NAME *)local_28._M_head_impl,0xd,0x1001,(uchar *)"AB",2,-1,-1);
    local_68[0] = iVar1 != 0;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)local_68,
                 (AssertionResult *)"append_entry_prev_rdn(\"AB\")","false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1bb9,(char *)CONCAT71(local_48._1_7_,local_48[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
      goto LAB_00407e02;
    }
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1c = i2d_X509_NAME((X509_NAME *)local_28._M_head_impl,(uchar **)&local_70);
    local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffff00000000);
    testing::internal::CmpHelperGT<int,int>
              ((internal *)local_48,"der_len","0",&local_1c,(int *)local_68);
    if (local_48[0] != (internal)0x0) {
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
      local_18._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_70._M_head_impl;
      local_68 = (undefined1  [8])TestBody::kExpected;
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x87;
      local_58.span_.size_ = (size_t)local_1c;
      local_58.span_.data_ = (uchar *)local_70._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_48,"Bytes(kExpected)","Bytes(der, der_len)",(Bytes *)local_68,
                 &local_58);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_68);
        if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_40->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x1be6,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
        if (local_68 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_68 + 8))();
        }
      }
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_18);
      goto LAB_00407e49;
    }
    testing::Message::Message((Message *)local_68);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1bbd,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00407e49;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_40;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_40);
LAB_00407e49:
  std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_28);
  return;
}

Assistant:

TEST(X509Test, SortRDN) {
  bssl::UniquePtr<X509_NAME> name(X509_NAME_new());
  ASSERT_TRUE(name);

  auto append_entry_new_rdn = [&](const char *str) {
    return X509_NAME_add_entry_by_NID(name.get(), NID_commonName, MBSTRING_ASC,
                                      reinterpret_cast<const uint8_t *>(str),
                                      strlen(str), /*loc=*/-1, /*set=*/0);
  };
  auto append_entry_prev_rdn = [&](const char *str) {
    return X509_NAME_add_entry_by_NID(name.get(), NID_commonName, MBSTRING_ASC,
                                      reinterpret_cast<const uint8_t *>(str),
                                      strlen(str), /*loc=*/-1, /*set=*/-1);
  };

  // This is the sort order to expect.
  ASSERT_TRUE(append_entry_new_rdn("A"));
  ASSERT_TRUE(append_entry_prev_rdn("B"));
  ASSERT_TRUE(append_entry_prev_rdn("AA"));
  ASSERT_TRUE(append_entry_prev_rdn("AB"));

  // The same RDN, with entries added in a different order.
  ASSERT_TRUE(append_entry_new_rdn("AB"));
  ASSERT_TRUE(append_entry_prev_rdn("AA"));
  ASSERT_TRUE(append_entry_prev_rdn("B"));
  ASSERT_TRUE(append_entry_prev_rdn("A"));

  // The same RDN, with entries added in a different order.
  ASSERT_TRUE(append_entry_new_rdn("A"));
  ASSERT_TRUE(append_entry_prev_rdn("AA"));
  ASSERT_TRUE(append_entry_prev_rdn("B"));
  ASSERT_TRUE(append_entry_prev_rdn("AB"));

  uint8_t *der = nullptr;
  int der_len = i2d_X509_NAME(name.get(), &der);
  ASSERT_GT(der_len, 0);
  bssl::UniquePtr<uint8_t> free_der(der);

  // SEQUENCE {
  //   SET {
  //     SEQUENCE {
  //       # commonName
  //       OBJECT_IDENTIFIER { 2.5.4.3 }
  //       UTF8String { "A" }
  //     }
  //     SEQUENCE {
  //       # commonName
  //       OBJECT_IDENTIFIER { 2.5.4.3 }
  //       UTF8String { "B" }
  //     }
  //     SEQUENCE {
  //       # commonName
  //       OBJECT_IDENTIFIER { 2.5.4.3 }
  //       UTF8String { "AA" }
  //     }
  //     SEQUENCE {
  //       # commonName
  //       OBJECT_IDENTIFIER { 2.5.4.3 }
  //       UTF8String { "AB" }
  //     }
  //   }
  //   ...two more copies of the above SET...
  // }
  static uint8_t kExpected[] = {
      0x30, 0x81, 0x84, 0x31, 0x2a, 0x30, 0x08, 0x06, 0x03, 0x55, 0x04, 0x03,
      0x0c, 0x01, 0x41, 0x30, 0x08, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c, 0x01,
      0x42, 0x30, 0x09, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c, 0x02, 0x41, 0x41,
      0x30, 0x09, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c, 0x02, 0x41, 0x42, 0x31,
      0x2a, 0x30, 0x08, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c, 0x01, 0x41, 0x30,
      0x08, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c, 0x01, 0x42, 0x30, 0x09, 0x06,
      0x03, 0x55, 0x04, 0x03, 0x0c, 0x02, 0x41, 0x41, 0x30, 0x09, 0x06, 0x03,
      0x55, 0x04, 0x03, 0x0c, 0x02, 0x41, 0x42, 0x31, 0x2a, 0x30, 0x08, 0x06,
      0x03, 0x55, 0x04, 0x03, 0x0c, 0x01, 0x41, 0x30, 0x08, 0x06, 0x03, 0x55,
      0x04, 0x03, 0x0c, 0x01, 0x42, 0x30, 0x09, 0x06, 0x03, 0x55, 0x04, 0x03,
      0x0c, 0x02, 0x41, 0x41, 0x30, 0x09, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c,
      0x02, 0x41, 0x42};
  EXPECT_EQ(Bytes(kExpected), Bytes(der, der_len));
}